

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O3

uint8_t * BrotliDecoderTakeOutput(BrotliDecoderStateInternal *s,size_t *size)

{
  BrotliDecoderErrorCode e;
  size_t sVar1;
  size_t available_out;
  size_t local_28;
  uint8_t *local_20;
  
  local_20 = (uint8_t *)0x0;
  sVar1 = 0x1000000;
  if (*size != 0) {
    sVar1 = *size;
  }
  if ((s->ringbuffer != (uint8_t *)0x0) && (-1 < s->error_code)) {
    local_28 = sVar1;
    WrapRingBuffer(s);
    e = WriteRingBuffer(s,&local_28,&local_20,(size_t *)0x0,1);
    if ((e & BROTLI_DECODER_ERROR_FORMAT_EXUBERANT_META_NIBBLE) == BROTLI_DECODER_SUCCESS) {
      *size = sVar1 - local_28;
      return local_20;
    }
    if (e < BROTLI_DECODER_NO_ERROR) {
      SaveErrorCode(s,e);
    }
  }
  *size = 0;
  return (uint8_t *)0x0;
}

Assistant:

const uint8_t* BrotliDecoderTakeOutput(BrotliDecoderState* s, size_t* size) {
  uint8_t* result = 0;
  size_t available_out = *size ? *size : 1u << 24;
  size_t requested_out = available_out;
  BrotliDecoderErrorCode status;
  if ((s->ringbuffer == 0) || ((int)s->error_code < 0)) {
    *size = 0;
    return 0;
  }
  WrapRingBuffer(s);
  status = WriteRingBuffer(s, &available_out, &result, 0, BROTLI_TRUE);
  /* Either WriteRingBuffer returns those "success" codes... */
  if (status == BROTLI_DECODER_SUCCESS ||
      status == BROTLI_DECODER_NEEDS_MORE_OUTPUT) {
    *size = requested_out - available_out;
  } else {
    /* ... or stream is broken. Normally this should be caught by
       BrotliDecoderDecompressStream, this is just a safeguard. */
    if ((int)status < 0) SaveErrorCode(s, status);
    *size = 0;
    result = 0;
  }
  return result;
}